

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

uint * stack(uint *a,uint alen,uint *b,uint blen,uint *out_size)

{
  uint *puVar1;
  uint len;
  ulong uVar2;
  uint *puVar3;
  
  len = blen + alen;
  if (out_size != (uint *)0x0) {
    *out_size = len;
  }
  puVar1 = vector_new(len);
  for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
    puVar3 = b + ((int)uVar2 - alen);
    if (uVar2 < alen) {
      puVar3 = a;
    }
    puVar1[uVar2] = *puVar3;
    a = a + 1;
  }
  return puVar1;
}

Assistant:

uint32_t *stack(uint32_t *a, uint32_t alen, uint32_t *b, uint32_t blen, uint32_t *out_size)
{
    uint32_t size = alen + blen;
    if (out_size != NULL)
        *out_size = alen + blen;

    uint32_t *c = vector_new(size);

    for (uint32_t i = 0; i < size; i++)
        c[i] = i < alen ? a[i] : b[i - alen];
    return c;
}